

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O2

void __thiscall PatternModel::setPatterns(PatternModel *this,int pattern,CursorChangeFlags *flags)

{
  int iVar1;
  int _t1;
  Song *this_00;
  Pattern local_58;
  
  this_00 = source(this);
  if (this->mShowPreviews == true) {
    setPreviewPatterns(this,pattern);
  }
  iVar1 = trackerboy::Pattern::totalRows(&this->mPatternCurr);
  trackerboy::Song::getPattern(&local_58,this_00,pattern);
  (this->mPatternCurr).mRowCount = local_58.mRowCount;
  (this->mPatternCurr).mTrack3 = local_58.mTrack3;
  (this->mPatternCurr).mTrack4 = local_58.mTrack4;
  (this->mPatternCurr).mTrack1 = local_58.mTrack1;
  (this->mPatternCurr).mTrack2 = local_58.mTrack2;
  _t1 = trackerboy::Pattern::totalRows(&this->mPatternCurr);
  if (iVar1 != _t1) {
    patternSizeChanged(this,_t1);
  }
  invalidated(this);
  if (_t1 <= (this->mCursor).super_PatternCursorBase.row) {
    (this->mCursor).super_PatternCursorBase.row = _t1 + -1;
    *(byte *)&flags->i = (byte)flags->i | 1;
  }
  return;
}

Assistant:

void PatternModel::setPatterns(int pattern, CursorChangeFlags &flags) {

    auto song = source();

    if (mShowPreviews) {
        setPreviewPatterns(pattern);
    }

    // update the current pattern
    auto oldsize = mPatternCurr.totalRows();
    mPatternCurr = song->getPattern(pattern);
    auto newsize = mPatternCurr.totalRows();

    if (oldsize != newsize) {
        emit patternSizeChanged(newsize);
    }

    emit invalidated();

    if (mCursor.row >= newsize) {
        mCursor.row = newsize - 1;
        flags |= CursorRowChanged;
    }
}